

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  u8 uVar5;
  int iVar6;
  size_t __n;
  u16 uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    return 0;
  }
  if (pMem->db == (sqlite3 *)0x0) {
    iVar6 = 1000000000;
  }
  else {
    iVar6 = pMem->db->aLimit[0];
  }
  uVar8 = 2;
  if (enc == '\0') {
    uVar8 = 0x10;
  }
  if (n < 0) {
    lVar10 = 0;
    if (enc == '\x01') {
      for (; (lVar10 <= iVar6 && (z[lVar10] != '\0')); lVar10 = lVar10 + 1) {
      }
    }
    else {
      for (; (lVar10 <= iVar6 && (z[lVar10 + 1] != '\0' || z[lVar10] != '\0')); lVar10 = lVar10 + 2)
      {
      }
    }
    n = (int)lVar10;
    uVar8 = uVar8 | 0x200;
  }
  uVar7 = (u16)uVar8;
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    iVar9 = 0;
    if (uVar8 >> 9 != 0) {
      iVar9 = (enc != '\x01') + 1;
    }
    if (iVar6 < n) {
      return 0x12;
    }
    iVar4 = sqlite3VdbeMemGrow(pMem,iVar9 + n,0);
    if (iVar4 != 0) {
      return 7;
    }
    memcpy(pMem->z,z,(long)(iVar9 + n));
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    if (xDel == sqlite3MallocSize) {
      pMem->zMalloc = z;
      pMem->xDel = (_func_void_void_ptr *)0x0;
    }
    else {
      pMem->xDel = xDel;
      uVar7 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar7 + 0x400;
    }
  }
  pMem->n = n;
  pMem->flags = uVar7;
  iVar9 = 0;
  uVar5 = '\x01';
  if (1 < enc) {
    uVar5 = enc;
  }
  pMem->enc = uVar5;
  pMem->type = (enc == '\0') + '\x03';
  if ((1 < enc) && (1 < n)) {
    cVar2 = *pMem->z;
    cVar3 = pMem->z[1];
    uVar5 = '\x02';
    if ((cVar3 == -2 && cVar2 == -1) || (uVar5 = '\x03', cVar3 == -1 && cVar2 == -2)) {
      iVar4 = sqlite3VdbeMemMakeWriteable(pMem);
      if (iVar4 != 0) {
        return 7;
      }
      __n = (long)pMem->n - 2;
      pMem->n = (int)__n;
      memmove(pMem->z,pMem->z + 2,__n);
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 | 2;
      pMem->enc = uVar5;
    }
  }
  if (iVar6 < n) {
    iVar9 = 0x12;
  }
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags & MEM_RowSet)==0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      for(nByte=0; nByte<=iLimit && z[nByte]; nByte++){}
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    int nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return SQLITE_TOOBIG;
    }
    if( sqlite3VdbeMemGrow(pMem, nAlloc, 0) ){
      return SQLITE_NOMEM;
    }
    memcpy(pMem->z, z, nAlloc);
  }else if( xDel==SQLITE_DYNAMIC ){
    sqlite3VdbeMemRelease(pMem);
    pMem->zMalloc = pMem->z = (char *)z;
    pMem->xDel = 0;
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    pMem->xDel = xDel;
    flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);
  pMem->type = (enc==0 ? SQLITE_BLOB : SQLITE_TEXT);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}